

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O2

void __thiscall S2EdgeCrosser::RestartAt(S2EdgeCrosser *this,S2Point *c)

{
  bool bVar1;
  int iVar2;
  S2LogMessage local_20;
  
  bVar1 = S2::IsUnitLength(c);
  if (bVar1) {
    this->c_ = c;
    iVar2 = s2pred::TriageSign(this->a_,this->b_,c,&this->a_cross_b_);
    this->acb_ = -iVar2;
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
             ,0x102,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_20.stream_,"Check failed: S2::IsUnitLength(*c) ");
  abort();
}

Assistant:

inline void S2EdgeCrosser::RestartAt(const S2Point* c) {
  S2_DCHECK(S2::IsUnitLength(*c));
  c_ = c;
  acb_ = -s2pred::TriageSign(*a_, *b_, *c_, a_cross_b_);
}